

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

bool __thiscall helics::EndpointInfo::updateTimeInclusive(EndpointInfo *this,Time newTime)

{
  int iVar1;
  _Elt_pointer puVar2;
  int iVar3;
  _Elt_pointer puVar4;
  _Map_pointer ppuVar5;
  _Elt_pointer puVar6;
  handle handle;
  unique_lock<std::shared_mutex> local_30;
  
  local_30._M_device = &(this->message_queue).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  puVar4 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar2 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar4 == puVar2) {
    iVar3 = 0;
  }
  else {
    puVar6 = (this->message_queue).m_obj.
             super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar5 = (this->message_queue).m_obj.
              super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    iVar3 = 0;
    do {
      if (newTime.internalTimeCode <
          (((puVar4->_M_t).
            super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode)
      break;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar6) {
        puVar4 = ppuVar5[1];
        ppuVar5 = ppuVar5 + 1;
        puVar6 = puVar4 + 0x40;
      }
      iVar3 = iVar3 + 1;
    } while (puVar4 != puVar2);
  }
  iVar1 = (this->mAvailableMessages).super___atomic_base<int>._M_i;
  if (iVar3 != iVar1) {
    LOCK();
    (this->mAvailableMessages).super___atomic_base<int>._M_i = iVar3;
    UNLOCK();
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  return iVar3 != iVar1;
}

Assistant:

bool EndpointInfo::updateTimeInclusive(Time newTime)
{
    int index{0};
    auto handle = message_queue.lock();

    auto message = handle.begin();
    auto it_final = handle.end();
    while (message != it_final) {
        if ((*message)->time > newTime) {
            break;
        }
        ++index;
        ++message;
    }
    if (index != mAvailableMessages.load()) {
        mAvailableMessages.store(index);
        return true;
    }
    return false;
}